

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeBigIntPrototype
               (DynamicObject *bigIntPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  RuntimeFunction **ppRVar1;
  JavascriptLibrary *library;
  int numberOfProperties;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *bigIntPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,bigIntPrototype,mode,1,0);
  this = RecyclableObject::GetLibrary(&bigIntPrototype->super_RecyclableObject);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).bigIntConstructor);
  AddMember(this,bigIntPrototype,0x67,*ppRVar1);
  DynamicObject::SetHasNoEnumerableProperties(bigIntPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeBigIntPrototype(DynamicObject* bigIntPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        const int numberOfProperties = 1;
        typeHandler->Convert(bigIntPrototype, mode, numberOfProperties);
        // TODO(BigInt): Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterBigInt
        // so that the update is in sync with profiler
        JavascriptLibrary* library = bigIntPrototype->GetLibrary();
        library->AddMember(bigIntPrototype, PropertyIds::constructor, library->bigIntConstructor);

        bigIntPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }